

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenLoopSetName(BinaryenExpressionRef expr,char *name)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)name;
  name_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::Loop>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Loop>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x829,"void BinaryenLoopSetName(BinaryenExpressionRef, const char *)");
  }
  wasm::Name::Name(&local_30,(char *)expression);
  wasm::Name::operator=((Name *)(local_20 + 1),&local_30);
  return;
}

Assistant:

void BinaryenLoopSetName(BinaryenExpressionRef expr, const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Loop>());
  // may be null or empty
  static_cast<Loop*>(expression)->name = name;
}